

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stereo_calib.cpp
# Opt level: O0

void StereoCalib(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *imagelist,Size *boardSize,float squareSize,bool displayCorners,bool useCalibrated,
                bool showRectified)

{
  string *this;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  byte bVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  int _y;
  int _width;
  int _height;
  size_type sVar9;
  reference pvVar10;
  ostream *poVar11;
  const_reference pvVar12;
  reference this_00;
  reference pvVar13;
  reference pvVar14;
  float *pfVar15;
  FileStorage *pFVar16;
  double *pdVar17;
  reference pvVar18;
  undefined7 in_register_00000081;
  undefined8 uVar19;
  double dVar20;
  double dVar21;
  pointer *local_29e8;
  Mat *local_29d0;
  Mat *local_29b8;
  pointer *local_29a0;
  Mat *local_2988;
  int local_2950;
  int local_2944;
  pointer *local_2918;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *local_28e8;
  Mat *local_28d0;
  Rect_<int> *local_2818;
  Mat *local_2788;
  Mat *local_2700;
  vector<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_> *local_26e8;
  Mat *local_26b0;
  Mat *local_2698;
  int local_266c;
  pointer *local_2630;
  undefined1 local_2618 [7];
  char c_1;
  allocator local_25f9;
  string local_25f8 [32];
  _InputArray local_25d8;
  allocator local_25b9;
  string local_25b8 [32];
  Scalar_<double> local_2598;
  Point_<int> local_2578;
  Point_<int> local_2570;
  _InputOutputArray local_2568;
  Scalar_<double> local_2550;
  Point_<int> local_2530;
  Point_<int> local_2528;
  _InputOutputArray local_2520;
  Scalar_<double> local_2508;
  Point_<int> local_24e8;
  Point_<int> local_24e0;
  _InputOutputArray local_24d8;
  Scalar_<double> local_24c0;
  Point_<int> local_24a0;
  Point_<int> local_2498;
  _InputOutputArray local_2490;
  Scalar_<double> local_2478;
  Rect_<int> local_2458;
  _InputOutputArray local_2448;
  Scalar_<double> local_2430;
  Rect_<int> local_2410;
  _InputOutputArray local_2400;
  undefined1 local_23e8 [8];
  Rect vroi;
  _OutputArray local_23d0;
  _InputArray local_23b8;
  MatSize local_23a0;
  _OutputArray local_2398;
  _InputArray local_2380;
  Rect_<int> local_2368;
  Rect_<int> local_2358;
  undefined1 local_2348 [8];
  Mat canvasPart_orig;
  Rect_<int> local_22d8;
  undefined1 local_22c8 [8];
  Mat canvasPart;
  _InputArray local_2250;
  _InputArray local_2238;
  _InputArray local_2220;
  Scalar_<double> local_2208;
  _InputArray local_21e8;
  _InputArray local_21d0;
  _OutputArray local_21b8;
  _InputArray local_21a0;
  undefined1 local_2188 [8];
  Mat gimg;
  Mat cimg_1;
  Mat rimg;
  Mat img_1;
  int h;
  int w;
  double sf;
  Mat canvas_orig;
  Mat canvas;
  _OutputArray local_1f20;
  Size_<int> local_1f08;
  _InputArray local_1f00;
  _InputArray local_1ee8;
  _InputArray local_1ed0;
  _InputArray local_1eb8;
  _OutputArray local_1ea0;
  _OutputArray local_1e88;
  Size_<int> local_1e70;
  _InputArray local_1e68;
  _InputArray local_1e50;
  _InputArray local_1e38;
  _InputArray local_1e20;
  Mat local_1e08 [3];
  Mat local_1ca8 [3];
  MatExpr local_1b48 [352];
  Mat local_19e8 [3];
  Mat local_1888 [3];
  MatExpr local_1728 [352];
  _OutputArray local_15c8;
  _OutputArray local_15b0;
  Size_<int> local_1598;
  _InputArray local_1590;
  Mat local_1578;
  _InputArray local_1518;
  Mat local_1500;
  _InputArray local_14a0;
  undefined1 local_1488 [8];
  Mat H2;
  Mat H1;
  _InputArray local_1368;
  Mat local_1350;
  _InputArray local_12f0;
  Mat local_12d8;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *local_1278;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *local_1270;
  __normal_iterator<cv::Point_<float>_*,_std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>
  local_1268;
  __normal_iterator<cv::Point_<float>_*,_std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>
  local_1260;
  undefined1 local_1258 [8];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> allimgpt [2];
  Mat rmap [2] [2];
  string local_1098 [7];
  bool isVerticalStereo;
  allocator local_1071;
  string local_1070 [32];
  Size_<int> local_1050;
  _OutputArray local_1048;
  _OutputArray local_1030;
  _OutputArray local_1018;
  _OutputArray local_1000;
  _OutputArray local_fe8;
  _InputArray local_fd0;
  _InputArray local_fb8;
  Size_<int> local_fa0;
  _InputArray local_f98;
  _InputArray local_f80;
  _InputArray local_f68;
  _InputArray local_f50;
  undefined1 local_f38 [8];
  Rect validRoi [2];
  undefined1 local_f10 [8];
  Mat Q;
  Mat P2;
  Mat P1;
  Mat R2;
  Mat R1;
  allocator local_d09;
  string local_d08 [32];
  FileStorage local_ce8 [8];
  FileStorage fs;
  double errij;
  _InputArray local_c88;
  _InputArray local_c70;
  _InputArray local_c58;
  Mat local_c40;
  _InputArray local_be0;
  _InputArray local_bc8;
  _InputArray local_bb0;
  _OutputArray local_b98;
  _InputArray local_b80;
  Mat local_b68;
  undefined1 local_b08 [8];
  Mat imgpt [2];
  undefined1 local_a38 [4];
  int npt;
  vector<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_> lines [2];
  int local_9fc;
  double dStack_9f8;
  int npoints;
  double err;
  _OutputArray local_9e0;
  _OutputArray local_9c8;
  _OutputArray local_9b0;
  _OutputArray local_998;
  Size_<int> local_980;
  _InputOutputArray local_978;
  _InputOutputArray local_960;
  _InputOutputArray local_948;
  _InputOutputArray local_930;
  _InputArray local_918;
  _InputArray local_900;
  _InputArray local_8e8;
  double local_8d0;
  double rms;
  Mat F;
  Mat E;
  Mat T;
  Mat R;
  _InputArray local_740;
  _InputArray local_728;
  Mat local_710;
  Size_<int> local_6b0;
  _InputArray local_6a8;
  _InputArray local_690;
  Mat local_678;
  undefined1 local_618 [8];
  Mat distCoeffs [2];
  Mat cameraMatrix [2];
  Point3_<float> local_48c;
  TermCriteria local_480;
  Size_<int> local_470;
  Size_<int> local_468;
  _InputOutputArray local_460;
  _InputArray local_448;
  char local_429;
  undefined1 local_428 [7];
  char c;
  allocator local_409;
  string local_408 [32];
  Size_<int> local_3e8;
  _OutputArray local_3e0;
  _InputArray local_3c8;
  double local_3b0;
  double sf_1;
  Size_<int> local_390;
  _InputOutputArray local_388;
  _InputArray local_370;
  _InputArray local_358;
  undefined1 local_340 [8];
  Mat cimg1;
  Mat cimg;
  undefined1 local_278 [8];
  Mat cornersMat;
  Size_<int> local_200;
  _InputArray local_1f8;
  Size_<int> local_1e0;
  _OutputArray local_1d8;
  _InputArray local_1c0;
  undefined1 local_1a8 [8];
  Mat timg;
  int scale;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *corners;
  bool found;
  Size_<int> local_12c;
  Size_<int> local_124;
  int local_11c;
  undefined1 local_118 [8];
  Mat img;
  string *filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  goodImageList;
  int local_90;
  int nimages;
  int k;
  int j;
  int i;
  Size_<int> local_78;
  Size imageSize;
  vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  objectPoints;
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  imagePoints [2];
  int maxScale;
  bool showRectified_local;
  bool useCalibrated_local;
  bool displayCorners_local;
  float squareSize_local;
  Size *boardSize_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *imagelist_local;
  
  uVar19._1_7_ = in_register_00000081;
  uVar19._0_1_ = showRectified;
  sVar9 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(imagelist);
  if ((sVar9 & 1) == 0) {
    imagePoints[1].
    super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
    local_2630 = &objectPoints.
                  super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      std::
      vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
      ::vector((vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                *)local_2630);
      local_2630 = local_2630 + 3;
    } while (local_2630 !=
             (pointer *)
             &imagePoints[1].
              super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
    ::vector((vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
              *)&imageSize);
    cv::Size_<int>::Size_(&local_78);
    sVar9 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(imagelist);
    goodImageList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         (int)((int)sVar9 + ((uint)(sVar9 >> 0x1f) & 1)) >> 1;
    std::
    vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
    ::resize((vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
              *)&objectPoints.
                 super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (long)goodImageList.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    std::
    vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
    ::resize((vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
              *)&imagePoints[0].
                 super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (long)goodImageList.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&filename);
    nimages = 0;
    for (k = 0; k < goodImageList.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; k = k + 1) {
      for (local_90 = 0; local_90 < 2; local_90 = local_90 + 1) {
        img.step.buf[1] =
             (size_t)std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](imagelist,(long)(local_90 + k * 2));
        cv::imread((string *)local_118,(int)img.step.buf[1]);
        bVar5 = cv::Mat::empty();
        if ((bVar5 & 1) == 0) {
          cv::Size_<int>::Size_(&local_124);
          bVar6 = cv::operator==(&local_78,&local_124);
          if (bVar6) {
            cv::MatSize::operator()((MatSize *)&local_12c);
            cv::Size_<int>::operator=(&local_78,&local_12c);
          }
          else {
            cv::MatSize::operator()((MatSize *)((long)&corners + 4));
            bVar6 = cv::operator!=((Size_<int> *)((long)&corners + 4),&local_78);
            if (bVar6) {
              poVar11 = std::operator<<((ostream *)&std::cout,"The image ");
              poVar11 = std::operator<<(poVar11,(string *)img.step.buf[1]);
              std::operator<<(poVar11,
                              " has the size different from the first image size. Skipping the pair\n"
                             );
              local_11c = 5;
              goto LAB_0010dabd;
            }
          }
          corners._3_1_ = 0;
          pvVar10 = std::
                    vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                    ::operator[]((vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                                  *)&imagePoints[(long)local_90 + -1].
                                     super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (long)nimages);
          for (timg.step.buf[1]._4_4_ = 1; timg.step.buf[1]._4_4_ < 3;
              timg.step.buf[1]._4_4_ = timg.step.buf[1]._4_4_ + 1) {
            cv::Mat::Mat((Mat *)local_1a8);
            if (timg.step.buf[1]._4_4_ == 1) {
              cv::Mat::operator=((Mat *)local_1a8,(Mat *)local_118);
            }
            else {
              cv::_InputArray::_InputArray(&local_1c0,(Mat *)local_118);
              cv::_OutputArray::_OutputArray(&local_1d8,(Mat *)local_1a8);
              cv::Size_<int>::Size_(&local_1e0);
              cv::resize(&local_1c0,&local_1d8,&local_1e0,5);
              cv::_OutputArray::~_OutputArray(&local_1d8);
              cv::_InputArray::~_InputArray(&local_1c0);
            }
            cv::_InputArray::_InputArray(&local_1f8,(Mat *)local_1a8);
            cv::Size_<int>::Size_(&local_200,boardSize);
            cv::_OutputArray::_OutputArray<cv::Point_<float>>
                      ((_OutputArray *)(cornersMat.step.buf + 1),pvVar10);
            bVar5 = cv::findChessboardCorners(&local_1f8,&local_200,cornersMat.step.buf + 1);
            corners._3_1_ = bVar5 & 1;
            cv::_OutputArray::~_OutputArray((_OutputArray *)(cornersMat.step.buf + 1));
            cv::_InputArray::~_InputArray(&local_1f8);
            if ((corners._3_1_ & 1) == 0) {
              local_11c = 0;
            }
            else {
              if (1 < timg.step.buf[1]._4_4_) {
                cv::Mat::Mat<cv::Point_<float>>((Mat *)local_278,pvVar10,false);
                cimg.step.buf[1] = (size_t)(1.0 / (double)timg.step.buf[1]._4_4_);
                cv::operator*=((Mat *)local_278,(double *)(cimg.step.buf + 1));
                cv::Mat::~Mat((Mat *)local_278);
              }
              local_11c = 8;
            }
            cv::Mat::~Mat((Mat *)local_1a8);
            if (local_11c != 0) break;
          }
          if (displayCorners) {
            poVar11 = std::operator<<((ostream *)&std::cout,(string *)img.step.buf[1]);
            std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
            cv::Mat::Mat((Mat *)(cimg1.step.buf + 1));
            cv::Mat::Mat((Mat *)local_340);
            cv::_InputArray::_InputArray(&local_358,(Mat *)local_118);
            cv::_OutputArray::_OutputArray((_OutputArray *)&local_370,(Mat *)(cimg1.step.buf + 1));
            cv::cvtColor((cv *)&local_358,&local_370,(_OutputArray *)0x8,0,(int)uVar19);
            cv::_OutputArray::~_OutputArray((_OutputArray *)&local_370);
            cv::_InputArray::~_InputArray(&local_358);
            cv::_InputOutputArray::_InputOutputArray(&local_388,(Mat *)(cimg1.step.buf + 1));
            cv::Size_<int>::Size_(&local_390,boardSize);
            cv::_InputArray::_InputArray<cv::Point_<float>>((_InputArray *)&sf_1,pvVar10);
            cv::drawChessboardCorners(&local_388,&local_390,&sf_1,corners._3_1_ & 1);
            cv::_InputArray::~_InputArray((_InputArray *)&sf_1);
            cv::_InputOutputArray::~_InputOutputArray(&local_388);
            if (img.flags < img.dims) {
              local_266c = img.dims;
            }
            else {
              local_266c = img.flags;
            }
            local_3b0 = 640.0 / (double)local_266c;
            cv::_InputArray::_InputArray(&local_3c8,(Mat *)(cimg1.step.buf + 1));
            cv::_OutputArray::_OutputArray(&local_3e0,(Mat *)local_340);
            cv::Size_<int>::Size_(&local_3e8);
            cv::resize(&local_3c8,&local_3e0,&local_3e8,5);
            cv::_OutputArray::~_OutputArray(&local_3e0);
            cv::_InputArray::~_InputArray(&local_3c8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_408,"corners",&local_409);
            cv::_InputArray::_InputArray((_InputArray *)local_428,(Mat *)local_340);
            cv::imshow(local_408,(_InputArray *)local_428);
            cv::_InputArray::~_InputArray((_InputArray *)local_428);
            std::__cxx11::string::~string(local_408);
            std::allocator<char>::~allocator((allocator<char> *)&local_409);
            local_429 = cv::waitKey(500);
            if (((local_429 == '\x1b') || (local_429 == 'q')) || (local_429 == 'Q')) {
              exit(-1);
            }
            cv::Mat::~Mat((Mat *)local_340);
            cv::Mat::~Mat((Mat *)(cimg1.step.buf + 1));
          }
          else {
            putchar(0x2e);
          }
          if ((corners._3_1_ & 1) == 0) {
            local_11c = 5;
          }
          else {
            cv::_InputArray::_InputArray(&local_448,(Mat *)local_118);
            cv::_InputOutputArray::_InputOutputArray<cv::Point_<float>>(&local_460,pvVar10);
            cv::Size_<int>::Size_(&local_468,0xb,0xb);
            cv::Size_<int>::Size_(&local_470,-1,-1);
            cv::TermCriteria::TermCriteria(&local_480,3,0x1e,0.01);
            uVar19 = local_480._0_8_;
            cv::cornerSubPix(local_480.epsilon,&local_448,&local_460,&local_468,&local_470);
            cv::_InputOutputArray::~_InputOutputArray(&local_460);
            cv::_InputArray::~_InputArray(&local_448);
            local_11c = 0;
          }
        }
        else {
          local_11c = 5;
        }
LAB_0010dabd:
        cv::Mat::~Mat((Mat *)local_118);
        if (local_11c != 0) break;
      }
      if (local_90 == 2) {
        pvVar12 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](imagelist,(long)(k * 2));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&filename,pvVar12);
        pvVar12 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](imagelist,(long)(k * 2 + 1));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&filename,pvVar12);
        nimages = nimages + 1;
      }
    }
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,nimages);
    std::operator<<(poVar11," pairs have been successfully detected.\n");
    goodImageList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = nimages;
    if (nimages < 2) {
      std::operator<<((ostream *)&std::cout,"Error: too little pairs to run the calibration\n");
      local_11c = 1;
    }
    else {
      std::
      vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
      ::resize((vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                *)&objectPoints.
                   super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)nimages);
      std::
      vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
      ::resize((vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                *)&imagePoints[0].
                   super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (long)goodImageList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      std::
      vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
      ::resize((vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                *)&imageSize,
               (long)goodImageList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      for (k = 0; k < goodImageList.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; k = k + 1) {
        for (nimages = 0; nimages < boardSize->height; nimages = nimages + 1) {
          for (local_90 = 0; local_90 < boardSize->width; local_90 = local_90 + 1) {
            this_00 = std::
                      vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                      ::operator[]((vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                                    *)&imageSize,(long)k);
            cv::Point3_<float>::Point3_
                      (&local_48c,(float)local_90 * squareSize,(float)nimages * squareSize,0.0);
            std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::push_back
                      (this_00,&local_48c);
          }
        }
      }
      std::operator<<((ostream *)&std::cout,"Running stereo calibration ...\n");
      local_2698 = (Mat *)(distCoeffs[1].step.buf + 1);
      do {
        cv::Mat::Mat(local_2698);
        local_2698 = local_2698 + 1;
      } while (local_2698 != (Mat *)(cameraMatrix[1].step.buf + 1));
      local_26b0 = (Mat *)local_618;
      do {
        cv::Mat::Mat(local_26b0);
        local_26b0 = local_26b0 + 1;
      } while (local_26b0 != (Mat *)(distCoeffs[1].step.buf + 1));
      cv::_InputArray::_InputArray<cv::Point3_<float>>
                (&local_690,
                 (vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                  *)&imageSize);
      cv::_InputArray::_InputArray<cv::Point_<float>>
                (&local_6a8,
                 (vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                  *)&objectPoints.
                     super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cv::Size_<int>::Size_(&local_6b0,&local_78);
      cv::initCameraMatrix2D(&local_678,&local_690,&local_6a8,&local_6b0);
      cv::Mat::operator=((Mat *)(distCoeffs[1].step.buf + 1),&local_678);
      cv::Mat::~Mat(&local_678);
      cv::_InputArray::~_InputArray(&local_6a8);
      cv::_InputArray::~_InputArray(&local_690);
      cv::_InputArray::_InputArray<cv::Point3_<float>>
                (&local_728,
                 (vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                  *)&imageSize);
      cv::_InputArray::_InputArray<cv::Point_<float>>
                (&local_740,
                 (vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                  *)&imagePoints[0].
                     super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cv::Size_<int>::Size_((Size_<int> *)(R.step.buf + 1),&local_78);
      cv::initCameraMatrix2D(&local_710,&local_728,&local_740,R.step.buf + 1);
      cv::Mat::operator=((Mat *)(cameraMatrix[0].step.buf + 1),&local_710);
      cv::Mat::~Mat(&local_710);
      cv::_InputArray::~_InputArray(&local_740);
      cv::_InputArray::~_InputArray(&local_728);
      cv::Mat::Mat((Mat *)(T.step.buf + 1));
      cv::Mat::Mat((Mat *)(E.step.buf + 1));
      cv::Mat::Mat((Mat *)(F.step.buf + 1));
      cv::Mat::Mat((Mat *)&rms);
      cv::_InputArray::_InputArray<cv::Point3_<float>>
                (&local_8e8,
                 (vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                  *)&imageSize);
      cv::_InputArray::_InputArray<cv::Point_<float>>
                (&local_900,
                 (vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                  *)&objectPoints.
                     super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cv::_InputArray::_InputArray<cv::Point_<float>>
                (&local_918,
                 (vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                  *)&imagePoints[0].
                     super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cv::_InputOutputArray::_InputOutputArray(&local_930,(Mat *)(distCoeffs[1].step.buf + 1));
      cv::_InputOutputArray::_InputOutputArray(&local_948,(Mat *)local_618);
      cv::_InputOutputArray::_InputOutputArray(&local_960,(Mat *)(cameraMatrix[0].step.buf + 1));
      cv::_InputOutputArray::_InputOutputArray(&local_978,(Mat *)(distCoeffs[0].step.buf + 1));
      cv::Size_<int>::Size_(&local_980,&local_78);
      cv::_OutputArray::_OutputArray(&local_998,(Mat *)(T.step.buf + 1));
      cv::_OutputArray::_OutputArray(&local_9b0,(Mat *)(E.step.buf + 1));
      cv::_OutputArray::_OutputArray(&local_9c8,(Mat *)(F.step.buf + 1));
      cv::_OutputArray::_OutputArray(&local_9e0,(Mat *)&rms);
      cv::TermCriteria::TermCriteria((TermCriteria *)&err,3,100,1e-05);
      dVar20 = (double)cv::stereoCalibrate(&local_8e8,&local_900,&local_918,&local_930,&local_948,
                                           &local_960);
      cv::_OutputArray::~_OutputArray(&local_9e0);
      cv::_OutputArray::~_OutputArray(&local_9c8);
      cv::_OutputArray::~_OutputArray(&local_9b0);
      cv::_OutputArray::~_OutputArray(&local_998);
      cv::_InputOutputArray::~_InputOutputArray(&local_978);
      cv::_InputOutputArray::~_InputOutputArray(&local_960);
      cv::_InputOutputArray::~_InputOutputArray(&local_948);
      cv::_InputOutputArray::~_InputOutputArray(&local_930);
      cv::_InputArray::~_InputArray(&local_918);
      cv::_InputArray::~_InputArray(&local_900);
      cv::_InputArray::~_InputArray(&local_8e8);
      local_8d0 = dVar20;
      poVar11 = std::operator<<((ostream *)&std::cout,"done with RMS error=");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_8d0);
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      dStack_9f8 = 0.0;
      local_9fc = 0;
      local_26e8 = (vector<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_> *)local_a38;
      do {
        std::vector<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>::vector(local_26e8);
        local_26e8 = local_26e8 + 1;
      } while (local_26e8 !=
               (vector<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_> *)
               &lines[1].super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
      for (k = 0; k < goodImageList.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; k = k + 1) {
        pvVar10 = std::
                  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                  ::operator[]((vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                                *)&objectPoints.
                                   super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)k);
        sVar9 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::size(pvVar10);
        local_2700 = (Mat *)local_b08;
        do {
          cv::Mat::Mat(local_2700);
          local_2700 = local_2700 + 1;
        } while (local_2700 != (Mat *)(imgpt[1].step.buf + 1));
        for (local_90 = 0; local_90 < 2; local_90 = local_90 + 1) {
          pvVar10 = std::
                    vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                    ::operator[]((vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                                  *)&imagePoints[(long)local_90 + -1].
                                     super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)k);
          cv::Mat::Mat<cv::Point_<float>>(&local_b68,pvVar10,false);
          cv::Mat::operator=((Mat *)(imgpt[(long)local_90 + -1].step.buf + 1),&local_b68);
          cv::Mat::~Mat(&local_b68);
          cv::_InputArray::_InputArray(&local_b80,(Mat *)(imgpt[(long)local_90 + -1].step.buf + 1));
          cv::_OutputArray::_OutputArray
                    (&local_b98,(Mat *)(imgpt[(long)local_90 + -1].step.buf + 1));
          cv::_InputArray::_InputArray
                    (&local_bb0,(Mat *)(distCoeffs[(long)local_90 + 1].step.buf + 1));
          cv::_InputArray::_InputArray
                    (&local_bc8,(Mat *)(distCoeffs[(long)local_90 + -1].step.buf + 1));
          cv::Mat::Mat(&local_c40);
          cv::_InputArray::_InputArray(&local_be0,&local_c40);
          cv::_InputArray::_InputArray
                    (&local_c58,(Mat *)(distCoeffs[(long)local_90 + 1].step.buf + 1));
          cv::undistortPoints(&local_b80,&local_b98,&local_bb0,&local_bc8,&local_be0,&local_c58);
          cv::_InputArray::~_InputArray(&local_c58);
          cv::_InputArray::~_InputArray(&local_be0);
          cv::Mat::~Mat(&local_c40);
          cv::_InputArray::~_InputArray(&local_bc8);
          cv::_InputArray::~_InputArray(&local_bb0);
          cv::_OutputArray::~_OutputArray(&local_b98);
          cv::_InputArray::~_InputArray(&local_b80);
          cv::_InputArray::_InputArray(&local_c70,(Mat *)(imgpt[(long)local_90 + -1].step.buf + 1));
          cv::_InputArray::_InputArray(&local_c88,(Mat *)&rms);
          cv::_OutputArray::_OutputArray<cv::Vec<float,3>>
                    ((_OutputArray *)&errij,
                     (vector<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_> *)
                     (local_a38 + (long)local_90 * 0x18));
          cv::computeCorrespondEpilines(&local_c70,local_90 + 1,&local_c88,(_OutputArray *)&errij);
          cv::_OutputArray::~_OutputArray((_OutputArray *)&errij);
          cv::_InputArray::~_InputArray(&local_c88);
          cv::_InputArray::~_InputArray(&local_c70);
        }
        for (nimages = 0; nimages < (int)sVar9; nimages = nimages + 1) {
          pvVar10 = std::
                    vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                    ::operator[]((vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                                  *)&objectPoints.
                                     super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)k);
          pvVar13 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                              (pvVar10,(long)nimages);
          fVar1 = pvVar13->x;
          pvVar14 = std::vector<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>::operator[]
                              ((vector<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_> *)
                               &lines[0].
                                super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)nimages);
          pfVar15 = cv::Vec<float,_3>::operator[](pvVar14,0);
          fVar2 = *pfVar15;
          pvVar10 = std::
                    vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                    ::operator[]((vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                                  *)&objectPoints.
                                     super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)k);
          pvVar13 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                              (pvVar10,(long)nimages);
          fVar3 = pvVar13->y;
          pvVar14 = std::vector<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>::operator[]
                              ((vector<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_> *)
                               &lines[0].
                                super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)nimages);
          pfVar15 = cv::Vec<float,_3>::operator[](pvVar14,1);
          fVar4 = *pfVar15;
          pvVar14 = std::vector<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>::operator[]
                              ((vector<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_> *)
                               &lines[0].
                                super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)nimages);
          pfVar15 = cv::Vec<float,_3>::operator[](pvVar14,2);
          dVar20 = std::fabs((double)(ulong)(uint)(fVar1 * fVar2 + fVar3 * fVar4 + *pfVar15));
          pvVar10 = std::
                    vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                    ::operator[]((vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                                  *)&imagePoints[0].
                                     super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)k);
          pvVar13 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                              (pvVar10,(long)nimages);
          fVar1 = pvVar13->x;
          pvVar14 = std::vector<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>::operator[]
                              ((vector<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_> *)
                               local_a38,(long)nimages);
          pfVar15 = cv::Vec<float,_3>::operator[](pvVar14,0);
          fVar2 = *pfVar15;
          pvVar10 = std::
                    vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                    ::operator[]((vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                                  *)&imagePoints[0].
                                     super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)k);
          pvVar13 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                              (pvVar10,(long)nimages);
          fVar3 = pvVar13->y;
          pvVar14 = std::vector<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>::operator[]
                              ((vector<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_> *)
                               local_a38,(long)nimages);
          pfVar15 = cv::Vec<float,_3>::operator[](pvVar14,1);
          fVar4 = *pfVar15;
          pvVar14 = std::vector<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>::operator[]
                              ((vector<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_> *)
                               local_a38,(long)nimages);
          pfVar15 = cv::Vec<float,_3>::operator[](pvVar14,2);
          dVar21 = std::fabs((double)(ulong)(uint)(fVar1 * fVar2 + fVar3 * fVar4 + *pfVar15));
          dStack_9f8 = (double)(SUB84(dVar20,0) + SUB84(dVar21,0)) + dStack_9f8;
        }
        local_9fc = (int)sVar9 + local_9fc;
        local_2788 = (Mat *)(imgpt[1].step.buf + 1);
        do {
          local_2788 = local_2788 + -1;
          cv::Mat::~Mat(local_2788);
        } while (local_2788 != (Mat *)local_b08);
      }
      poVar11 = std::operator<<((ostream *)&std::cout,"average epipolar err = ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,dStack_9f8 / (double)local_9fc);
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d08,"intrinsics.yml",&local_d09);
      this = (string *)(R1.step.buf + 1);
      std::__cxx11::string::string(this);
      cv::FileStorage::FileStorage(local_ce8,local_d08,1,this);
      std::__cxx11::string::~string((string *)(R1.step.buf + 1));
      std::__cxx11::string::~string(local_d08);
      std::allocator<char>::~allocator((allocator<char> *)&local_d09);
      bVar5 = cv::FileStorage::isOpened();
      if ((bVar5 & 1) == 0) {
        std::operator<<((ostream *)&std::cout,"Error: can not save the intrinsic parameters\n");
      }
      else {
        pFVar16 = cv::operator<<(local_ce8,"M1");
        pFVar16 = cv::operator<<(pFVar16,(Mat *)(distCoeffs[1].step.buf + 1));
        pFVar16 = cv::operator<<(pFVar16,"D1");
        pFVar16 = cv::operator<<(pFVar16,(Mat *)local_618);
        pFVar16 = cv::operator<<(pFVar16,"M2");
        pFVar16 = cv::operator<<(pFVar16,(Mat *)(cameraMatrix[0].step.buf + 1));
        pFVar16 = cv::operator<<(pFVar16,"D2");
        cv::operator<<(pFVar16,(Mat *)(distCoeffs[0].step.buf + 1));
        cv::FileStorage::release();
      }
      cv::Mat::Mat((Mat *)(R2.step.buf + 1));
      cv::Mat::Mat((Mat *)(P1.step.buf + 1));
      cv::Mat::Mat((Mat *)(P2.step.buf + 1));
      cv::Mat::Mat((Mat *)(Q.step.buf + 1));
      cv::Mat::Mat((Mat *)local_f10);
      local_2818 = (Rect_<int> *)local_f38;
      do {
        cv::Rect_<int>::Rect_(local_2818);
        local_2818 = local_2818 + 1;
      } while (local_2818 != (Rect_<int> *)&validRoi[1].width);
      cv::_InputArray::_InputArray(&local_f50,(Mat *)(distCoeffs[1].step.buf + 1));
      cv::_InputArray::_InputArray(&local_f68,(Mat *)local_618);
      cv::_InputArray::_InputArray(&local_f80,(Mat *)(cameraMatrix[0].step.buf + 1));
      cv::_InputArray::_InputArray(&local_f98,(Mat *)(distCoeffs[0].step.buf + 1));
      cv::Size_<int>::Size_(&local_fa0,&local_78);
      cv::_InputArray::_InputArray(&local_fb8,(Mat *)(T.step.buf + 1));
      cv::_InputArray::_InputArray(&local_fd0,(Mat *)(E.step.buf + 1));
      cv::_OutputArray::_OutputArray(&local_fe8,(Mat *)(R2.step.buf + 1));
      cv::_OutputArray::_OutputArray(&local_1000,(Mat *)(P1.step.buf + 1));
      cv::_OutputArray::_OutputArray(&local_1018,(Mat *)(P2.step.buf + 1));
      cv::_OutputArray::_OutputArray(&local_1030,(Mat *)(Q.step.buf + 1));
      cv::_OutputArray::_OutputArray(&local_1048,(Mat *)local_f10);
      cv::Size_<int>::Size_(&local_1050,&local_78);
      cv::stereoRectify(0x3ff0000000000000,&local_f50,&local_f68,&local_f80,&local_f98,&local_fa0,
                        &local_fb8);
      cv::_OutputArray::~_OutputArray(&local_1048);
      cv::_OutputArray::~_OutputArray(&local_1030);
      cv::_OutputArray::~_OutputArray(&local_1018);
      cv::_OutputArray::~_OutputArray(&local_1000);
      cv::_OutputArray::~_OutputArray(&local_fe8);
      cv::_InputArray::~_InputArray(&local_fd0);
      cv::_InputArray::~_InputArray(&local_fb8);
      cv::_InputArray::~_InputArray(&local_f98);
      cv::_InputArray::~_InputArray(&local_f80);
      cv::_InputArray::~_InputArray(&local_f68);
      cv::_InputArray::~_InputArray(&local_f50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1070,"extrinsics.yml",&local_1071);
      std::__cxx11::string::string(local_1098);
      cv::FileStorage::open((string *)local_ce8,(int)local_1070,(string *)0x1);
      std::__cxx11::string::~string(local_1098);
      std::__cxx11::string::~string(local_1070);
      std::allocator<char>::~allocator((allocator<char> *)&local_1071);
      bVar5 = cv::FileStorage::isOpened();
      if ((bVar5 & 1) == 0) {
        std::operator<<((ostream *)&std::cout,"Error: can not save the extrinsic parameters\n");
      }
      else {
        pFVar16 = cv::operator<<(local_ce8,"R");
        pFVar16 = cv::operator<<(pFVar16,(Mat *)(T.step.buf + 1));
        pFVar16 = cv::operator<<(pFVar16,"T");
        pFVar16 = cv::operator<<(pFVar16,(Mat *)(E.step.buf + 1));
        pFVar16 = cv::operator<<(pFVar16,"R1");
        pFVar16 = cv::operator<<(pFVar16,(Mat *)(R2.step.buf + 1));
        pFVar16 = cv::operator<<(pFVar16,"R2");
        pFVar16 = cv::operator<<(pFVar16,(Mat *)(P1.step.buf + 1));
        pFVar16 = cv::operator<<(pFVar16,"P1");
        pFVar16 = cv::operator<<(pFVar16,(Mat *)(P2.step.buf + 1));
        pFVar16 = cv::operator<<(pFVar16,"P2");
        pFVar16 = cv::operator<<(pFVar16,(Mat *)(Q.step.buf + 1));
        pFVar16 = cv::operator<<(pFVar16,"Q");
        cv::operator<<(pFVar16,(Mat *)local_f10);
        cv::FileStorage::release();
      }
      pdVar17 = cv::Mat::at<double>((Mat *)(Q.step.buf + 1),1,3);
      dVar20 = *pdVar17;
      pdVar17 = cv::Mat::at<double>((Mat *)(Q.step.buf + 1),0,3);
      bVar6 = ABS(*pdVar17) < ABS(dVar20);
      if (showRectified) {
        local_28d0 = (Mat *)&allimgpt[1].
                             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        do {
          cv::Mat::Mat(local_28d0);
          local_28d0 = local_28d0 + 1;
        } while (local_28d0 != (Mat *)(rmap[1][1].step.buf + 1));
        if (!useCalibrated) {
          local_28e8 = (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_1258;
          do {
            std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector(local_28e8);
            local_28e8 = local_28e8 + 1;
          } while (local_28e8 !=
                   (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                   &allimgpt[1].
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
          for (local_90 = 0; local_90 < 2; local_90 = local_90 + 1) {
            for (k = 0; k < goodImageList.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; k = k + 1) {
              pvVar10 = std::
                        vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                        ::operator[]((vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                                      *)&imagePoints[(long)local_90 + -1].
                                         super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)k)
              ;
              local_1260._M_current =
                   (Point_<float> *)
                   std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::begin
                             (pvVar10);
              pvVar10 = std::
                        vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                        ::operator[]((vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                                      *)&imagePoints[(long)local_90 + -1].
                                         super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)k)
              ;
              local_1268._M_current =
                   (Point_<float> *)
                   std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::end(pvVar10)
              ;
              local_1270 = (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                           std::
                           back_inserter<std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>>
                                     ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                       *)&allimgpt[(long)local_90 + -1].
                                          super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              local_1278 = (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                           std::
                           copy<__gnu_cxx::__normal_iterator<cv::Point_<float>*,std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>>,std::back_insert_iterator<std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>>>
                                     (local_1260,local_1268,
                                      (back_insert_iterator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>
                                       )local_1270);
            }
          }
          cv::Mat::Mat<cv::Point_<float>>
                    (&local_1350,
                     (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_1258,
                     false);
          cv::_InputArray::_InputArray(&local_12f0,&local_1350);
          cv::Mat::Mat<cv::Point_<float>>
                    ((Mat *)(H1.step.buf + 1),
                     (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                     &allimgpt[0].
                      super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,false);
          cv::_InputArray::_InputArray(&local_1368,(Mat *)(H1.step.buf + 1));
          cv::noArray();
          cv::findFundamentalMat
                    ((_InputArray *)&local_12d8,&local_12f0,(int)&local_1368,0.0,0.0,
                     (_OutputArray *)0x2);
          cv::Mat::operator=((Mat *)&rms,&local_12d8);
          cv::Mat::~Mat(&local_12d8);
          cv::_InputArray::~_InputArray(&local_1368);
          cv::Mat::~Mat((Mat *)(H1.step.buf + 1));
          cv::_InputArray::~_InputArray(&local_12f0);
          cv::Mat::~Mat(&local_1350);
          cv::Mat::Mat((Mat *)(H2.step.buf + 1));
          cv::Mat::Mat((Mat *)local_1488);
          cv::Mat::Mat<cv::Point_<float>>
                    (&local_1500,
                     (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_1258,
                     false);
          cv::_InputArray::_InputArray(&local_14a0,&local_1500);
          cv::Mat::Mat<cv::Point_<float>>
                    (&local_1578,
                     (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                     &allimgpt[0].
                      super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,false);
          cv::_InputArray::_InputArray(&local_1518,&local_1578);
          cv::_InputArray::_InputArray(&local_1590,(Mat *)&rms);
          cv::Size_<int>::Size_(&local_1598,&local_78);
          cv::_OutputArray::_OutputArray(&local_15b0,(Mat *)(H2.step.buf + 1));
          cv::_OutputArray::_OutputArray(&local_15c8,(Mat *)local_1488);
          cv::stereoRectifyUncalibrated
                    (0x4008000000000000,&local_14a0,&local_1518,&local_1590,&local_1598,&local_15b0,
                     &local_15c8);
          cv::_OutputArray::~_OutputArray(&local_15c8);
          cv::_OutputArray::~_OutputArray(&local_15b0);
          cv::_InputArray::~_InputArray(&local_1590);
          cv::_InputArray::~_InputArray(&local_1518);
          cv::Mat::~Mat(&local_1578);
          cv::_InputArray::~_InputArray(&local_14a0);
          cv::Mat::~Mat(&local_1500);
          cv::Mat::inv((int)local_19e8);
          cv::operator*((MatExpr *)local_1888,local_19e8);
          cv::operator*(local_1728,local_1888);
          cv::Mat::operator=((Mat *)(R2.step.buf + 1),local_1728);
          cv::MatExpr::~MatExpr(local_1728);
          cv::MatExpr::~MatExpr((MatExpr *)local_1888);
          cv::MatExpr::~MatExpr((MatExpr *)local_19e8);
          cv::Mat::inv((int)local_1e08);
          cv::operator*((MatExpr *)local_1ca8,local_1e08);
          cv::operator*(local_1b48,local_1ca8);
          cv::Mat::operator=((Mat *)(P1.step.buf + 1),local_1b48);
          cv::MatExpr::~MatExpr(local_1b48);
          cv::MatExpr::~MatExpr((MatExpr *)local_1ca8);
          cv::MatExpr::~MatExpr((MatExpr *)local_1e08);
          cv::Mat::operator=((Mat *)(P2.step.buf + 1),(Mat *)(distCoeffs[1].step.buf + 1));
          cv::Mat::operator=((Mat *)(Q.step.buf + 1),(Mat *)(cameraMatrix[0].step.buf + 1));
          cv::Mat::~Mat((Mat *)local_1488);
          cv::Mat::~Mat((Mat *)(H2.step.buf + 1));
          local_2918 = &allimgpt[1].
                        super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
          do {
            local_2918 = local_2918 + -3;
            std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
                      ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_2918)
            ;
          } while (local_2918 != (pointer *)local_1258);
        }
        cv::_InputArray::_InputArray(&local_1e20,(Mat *)(distCoeffs[1].step.buf + 1));
        cv::_InputArray::_InputArray(&local_1e38,(Mat *)local_618);
        cv::_InputArray::_InputArray(&local_1e50,(Mat *)(R2.step.buf + 1));
        cv::_InputArray::_InputArray(&local_1e68,(Mat *)(P2.step.buf + 1));
        cv::Size_<int>::Size_(&local_1e70,&local_78);
        cv::_OutputArray::_OutputArray
                  (&local_1e88,
                   (Mat *)&allimgpt[1].
                           super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cv::_OutputArray::_OutputArray(&local_1ea0,(Mat *)(rmap[0][0].step.buf + 1));
        cv::initUndistortRectifyMap(&local_1e20,&local_1e38,&local_1e50,&local_1e68,&local_1e70,0xb)
        ;
        cv::_OutputArray::~_OutputArray(&local_1ea0);
        cv::_OutputArray::~_OutputArray(&local_1e88);
        cv::_InputArray::~_InputArray(&local_1e68);
        cv::_InputArray::~_InputArray(&local_1e50);
        cv::_InputArray::~_InputArray(&local_1e38);
        cv::_InputArray::~_InputArray(&local_1e20);
        cv::_InputArray::_InputArray(&local_1eb8,(Mat *)(cameraMatrix[0].step.buf + 1));
        cv::_InputArray::_InputArray(&local_1ed0,(Mat *)(distCoeffs[0].step.buf + 1));
        cv::_InputArray::_InputArray(&local_1ee8,(Mat *)(P1.step.buf + 1));
        cv::_InputArray::_InputArray(&local_1f00,(Mat *)(Q.step.buf + 1));
        cv::Size_<int>::Size_(&local_1f08,&local_78);
        cv::_OutputArray::_OutputArray(&local_1f20,(Mat *)(rmap[0][1].step.buf + 1));
        cv::_OutputArray::_OutputArray
                  ((_OutputArray *)(canvas.step.buf + 1),(Mat *)(rmap[1][0].step.buf + 1));
        cv::initUndistortRectifyMap(&local_1eb8,&local_1ed0,&local_1ee8,&local_1f00,&local_1f08);
        cv::_OutputArray::~_OutputArray((_OutputArray *)(canvas.step.buf + 1));
        cv::_OutputArray::~_OutputArray(&local_1f20);
        cv::_InputArray::~_InputArray(&local_1f00);
        cv::_InputArray::~_InputArray(&local_1ee8);
        cv::_InputArray::~_InputArray(&local_1ed0);
        cv::_InputArray::~_InputArray(&local_1eb8);
        cv::Mat::Mat((Mat *)(canvas_orig.step.buf + 1));
        cv::Mat::Mat((Mat *)&sf);
        if (bVar6) {
          if (local_78.width < local_78.height) {
            local_2950 = local_78.height;
          }
          else {
            local_2950 = local_78.width;
          }
          _h = 300.0 / (double)local_2950;
          img_1.step.buf[1]._4_4_ = cvRound((double)local_78.width * _h);
          img_1.step.buf[1]._0_4_ = cvRound((double)local_78.height * _h);
          cv::Mat::create((int)&canvas_orig + 0x58,(int)img_1.step.buf[1] * 2,
                          img_1.step.buf[1]._4_4_);
          cv::Mat::create((int)&sf,(int)img_1.step.buf[1] * 2,img_1.step.buf[1]._4_4_);
        }
        else {
          if (local_78.width < local_78.height) {
            local_2944 = local_78.height;
          }
          else {
            local_2944 = local_78.width;
          }
          _h = 600.0 / (double)local_2944;
          img_1.step.buf[1]._4_4_ = cvRound((double)local_78.width * _h);
          img_1.step.buf[1]._0_4_ = cvRound((double)local_78.height * _h);
          cv::Mat::create((int)&canvas_orig + 0x58,(int)img_1.step.buf[1],
                          img_1.step.buf[1]._4_4_ * 2);
          cv::Mat::create((int)&sf,(int)img_1.step.buf[1],img_1.step.buf[1]._4_4_ * 2);
        }
        for (k = 0; k < goodImageList.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; k = k + 1) {
          for (local_90 = 0; local_90 < 2; local_90 = local_90 + 1) {
            pvVar18 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&filename,(long)(local_90 + k * 2));
            cv::imread((string *)(rimg.step.buf + 1),(int)pvVar18);
            cv::Mat::Mat((Mat *)(cimg_1.step.buf + 1));
            cv::Mat::Mat((Mat *)(gimg.step.buf + 1));
            cv::Mat::Mat((Mat *)local_2188);
            cv::_InputArray::_InputArray(&local_21a0,(Mat *)(rimg.step.buf + 1));
            cv::_OutputArray::_OutputArray(&local_21b8,(Mat *)(cimg_1.step.buf + 1));
            cv::_InputArray::_InputArray
                      (&local_21d0,(Mat *)(rmap[(long)local_90 + -1][1].step.buf + 1));
            cv::_InputArray::_InputArray(&local_21e8,(Mat *)(rmap[local_90][0].step.buf + 1));
            cv::Scalar_<double>::Scalar_(&local_2208);
            iVar8 = 1;
            cv::remap(&local_21a0,&local_21b8,&local_21d0,&local_21e8,1,0,(Scalar_ *)&local_2208);
            cv::_InputArray::~_InputArray(&local_21e8);
            cv::_InputArray::~_InputArray(&local_21d0);
            cv::_OutputArray::~_OutputArray(&local_21b8);
            cv::_InputArray::~_InputArray(&local_21a0);
            cv::_InputArray::_InputArray(&local_2220,(Mat *)(cimg_1.step.buf + 1));
            cv::_OutputArray::_OutputArray((_OutputArray *)&local_2238,(Mat *)(gimg.step.buf + 1));
            cv::cvtColor((cv *)&local_2220,&local_2238,(_OutputArray *)0x8,0,iVar8);
            cv::_OutputArray::~_OutputArray((_OutputArray *)&local_2238);
            cv::_InputArray::~_InputArray(&local_2220);
            cv::_InputArray::_InputArray(&local_2250,(Mat *)(rimg.step.buf + 1));
            cv::_OutputArray::_OutputArray
                      ((_OutputArray *)(canvasPart.step.buf + 1),(Mat *)local_2188);
            cv::cvtColor((cv *)&local_2250,(_InputArray *)(canvasPart.step.buf + 1),
                         (_OutputArray *)0x8,0,iVar8);
            cv::_OutputArray::~_OutputArray((_OutputArray *)(canvasPart.step.buf + 1));
            cv::_InputArray::~_InputArray(&local_2250);
            if (bVar6) {
              cv::Rect_<int>::Rect_
                        ((Rect_<int> *)(canvasPart_orig.step.buf + 1),0,
                         (int)img_1.step.buf[1] * local_90,img_1.step.buf[1]._4_4_,
                         (int)img_1.step.buf[1]);
              cv::Mat::operator()((Mat *)local_22c8,(Mat *)(canvas_orig.step.buf + 1),
                                  (Rect *)(canvasPart_orig.step.buf + 1));
              cv::Rect_<int>::Rect_
                        (&local_2368,0,(int)img_1.step.buf[1] * local_90,img_1.step.buf[1]._4_4_,
                         (int)img_1.step.buf[1]);
              cv::Mat::operator()((Mat *)local_2348,(Mat *)&sf,&local_2368);
            }
            else {
              cv::Rect_<int>::Rect_
                        (&local_22d8,img_1.step.buf[1]._4_4_ * local_90,0,img_1.step.buf[1]._4_4_,
                         (int)img_1.step.buf[1]);
              cv::Mat::operator()((Mat *)local_22c8,(Mat *)(canvas_orig.step.buf + 1),&local_22d8);
              cv::Rect_<int>::Rect_
                        (&local_2358,img_1.step.buf[1]._4_4_ * local_90,0,img_1.step.buf[1]._4_4_,
                         (int)img_1.step.buf[1]);
              cv::Mat::operator()((Mat *)local_2348,(Mat *)&sf,&local_2358);
            }
            cv::_InputArray::_InputArray(&local_2380,(Mat *)(gimg.step.buf + 1));
            cv::_OutputArray::_OutputArray(&local_2398,(Mat *)local_22c8);
            cv::MatSize::operator()(&local_23a0);
            cv::resize(&local_2380,&local_2398,&local_23a0,3);
            cv::_OutputArray::~_OutputArray(&local_2398);
            cv::_InputArray::~_InputArray(&local_2380);
            cv::_InputArray::_InputArray(&local_23b8,(Mat *)local_2188);
            cv::_OutputArray::_OutputArray(&local_23d0,(Mat *)local_2348);
            cv::MatSize::operator()((MatSize *)&vroi.width);
            cv::resize(&local_23b8,&local_23d0,&vroi.width,3);
            cv::_OutputArray::~_OutputArray(&local_23d0);
            cv::_InputArray::~_InputArray(&local_23b8);
            if (useCalibrated) {
              iVar8 = cvRound((double)*(int *)(local_f38 + (long)local_90 * 0x10) * _h);
              _y = cvRound((double)validRoi[(long)local_90 + -1].height * _h);
              _width = cvRound((double)validRoi[local_90].x * _h);
              _height = cvRound((double)validRoi[local_90].y * _h);
              cv::Rect_<int>::Rect_((Rect_<int> *)local_23e8,iVar8,_y,_width,_height);
              cv::_InputOutputArray::_InputOutputArray(&local_2400,(Mat *)local_22c8);
              cv::Rect_<int>::Rect_(&local_2410,(Rect_<int> *)local_23e8);
              cv::Scalar_<double>::Scalar_(&local_2430,0.0,0.0,255.0,0.0);
              cv::rectangle(&local_2400,&local_2410,&local_2430,3,8);
              cv::_InputOutputArray::~_InputOutputArray(&local_2400);
              cv::_InputOutputArray::_InputOutputArray(&local_2448,(Mat *)local_2348);
              cv::Rect_<int>::Rect_(&local_2458,(Rect_<int> *)local_23e8);
              cv::Scalar_<double>::Scalar_(&local_2478,0.0,0.0,255.0,0.0);
              cv::rectangle(&local_2448,&local_2458,&local_2478,3,8);
              cv::_InputOutputArray::~_InputOutputArray(&local_2448);
            }
            cv::Mat::~Mat((Mat *)local_2348);
            cv::Mat::~Mat((Mat *)local_22c8);
            cv::Mat::~Mat((Mat *)local_2188);
            cv::Mat::~Mat((Mat *)(gimg.step.buf + 1));
            cv::Mat::~Mat((Mat *)(cimg_1.step.buf + 1));
            cv::Mat::~Mat((Mat *)(rimg.step.buf + 1));
          }
          if (bVar6) {
            for (nimages = 0; nimages < canvas.dims; nimages = nimages + 0x10) {
              cv::_InputOutputArray::_InputOutputArray
                        (&local_2520,(Mat *)(canvas_orig.step.buf + 1));
              cv::Point_<int>::Point_(&local_2528,nimages,0);
              cv::Point_<int>::Point_(&local_2530,nimages,canvas.flags);
              cv::Scalar_<double>::Scalar_(&local_2550,0.0,255.0,0.0,0.0);
              cv::line(&local_2520,&local_2528,&local_2530,&local_2550,1,8);
              cv::_InputOutputArray::~_InputOutputArray(&local_2520);
              cv::_InputOutputArray::_InputOutputArray(&local_2568,(Mat *)&sf);
              cv::Point_<int>::Point_(&local_2570,nimages,0);
              cv::Point_<int>::Point_(&local_2578,nimages,canvas_orig.flags);
              cv::Scalar_<double>::Scalar_(&local_2598,0.0,255.0,0.0,0.0);
              cv::line(&local_2568,&local_2570,&local_2578,&local_2598,1);
              cv::_InputOutputArray::~_InputOutputArray(&local_2568);
            }
          }
          else {
            for (nimages = 0; nimages < canvas.flags; nimages = nimages + 0x10) {
              cv::_InputOutputArray::_InputOutputArray
                        (&local_2490,(Mat *)(canvas_orig.step.buf + 1));
              cv::Point_<int>::Point_(&local_2498,0,nimages);
              cv::Point_<int>::Point_(&local_24a0,canvas.dims,nimages);
              cv::Scalar_<double>::Scalar_(&local_24c0,0.0,255.0,0.0,0.0);
              cv::line(&local_2490,&local_2498,&local_24a0,&local_24c0,1,8);
              cv::_InputOutputArray::~_InputOutputArray(&local_2490);
              cv::_InputOutputArray::_InputOutputArray(&local_24d8,(Mat *)&sf);
              cv::Point_<int>::Point_(&local_24e0,0,nimages);
              cv::Point_<int>::Point_(&local_24e8,canvas_orig.dims,nimages);
              cv::Scalar_<double>::Scalar_(&local_2508,0.0,255.0,0.0,0.0);
              cv::line(&local_24d8,&local_24e0,&local_24e8,&local_2508,1);
              cv::_InputOutputArray::~_InputOutputArray(&local_24d8);
            }
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_25b8,"rectified",&local_25b9);
          cv::_InputArray::_InputArray(&local_25d8,(Mat *)(canvas_orig.step.buf + 1));
          cv::imshow(local_25b8,&local_25d8);
          cv::_InputArray::~_InputArray(&local_25d8);
          std::__cxx11::string::~string(local_25b8);
          std::allocator<char>::~allocator((allocator<char> *)&local_25b9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_25f8,"unrectified",&local_25f9);
          cv::_InputArray::_InputArray((_InputArray *)local_2618,(Mat *)&sf);
          cv::imshow(local_25f8,(_InputArray *)local_2618);
          cv::_InputArray::~_InputArray((_InputArray *)local_2618);
          std::__cxx11::string::~string(local_25f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_25f9);
          cVar7 = cv::waitKey(0);
          if (((cVar7 == '\x1b') || (cVar7 == 'q')) || (cVar7 == 'Q')) break;
        }
        cv::Mat::~Mat((Mat *)&sf);
        cv::Mat::~Mat((Mat *)(canvas_orig.step.buf + 1));
        local_2988 = (Mat *)(rmap[1][1].step.buf + 1);
        do {
          local_2988 = local_2988 + -1;
          cv::Mat::~Mat(local_2988);
        } while (local_2988 !=
                 (Mat *)&allimgpt[1].
                         super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
        local_11c = 0;
      }
      else {
        local_11c = 1;
      }
      cv::Mat::~Mat((Mat *)local_f10);
      cv::Mat::~Mat((Mat *)(Q.step.buf + 1));
      cv::Mat::~Mat((Mat *)(P2.step.buf + 1));
      cv::Mat::~Mat((Mat *)(P1.step.buf + 1));
      cv::Mat::~Mat((Mat *)(R2.step.buf + 1));
      cv::FileStorage::~FileStorage(local_ce8);
      local_29a0 = &lines[1].
                    super__Vector_base<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
      do {
        local_29a0 = local_29a0 + -3;
        std::vector<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_>::~vector
                  ((vector<cv::Vec<float,_3>,_std::allocator<cv::Vec<float,_3>_>_> *)local_29a0);
      } while (local_29a0 != (pointer *)local_a38);
      cv::Mat::~Mat((Mat *)&rms);
      cv::Mat::~Mat((Mat *)(F.step.buf + 1));
      cv::Mat::~Mat((Mat *)(E.step.buf + 1));
      cv::Mat::~Mat((Mat *)(T.step.buf + 1));
      local_29b8 = (Mat *)(distCoeffs[1].step.buf + 1);
      do {
        local_29b8 = local_29b8 + -1;
        cv::Mat::~Mat(local_29b8);
      } while (local_29b8 != (Mat *)local_618);
      local_29d0 = (Mat *)(cameraMatrix[1].step.buf + 1);
      do {
        local_29d0 = local_29d0 + -1;
        cv::Mat::~Mat(local_29d0);
      } while (local_29d0 != (Mat *)(distCoeffs[1].step.buf + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&filename);
    std::
    vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
    ::~vector((vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
               *)&imageSize);
    local_29e8 = &imagePoints[1].
                  super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      local_29e8 = local_29e8 + -3;
      std::
      vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
      ::~vector((vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                 *)local_29e8);
    } while ((pointer *)local_29e8 !=
             &objectPoints.
              super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    std::operator<<((ostream *)&std::cout,
                    "Error: the image list contains odd (non-even) number of elements\n");
  }
  return;
}

Assistant:

static void
StereoCalib(const vector<string>& imagelist, Size boardSize, float squareSize, bool displayCorners = false, bool useCalibrated=true, bool showRectified=true)
{
    if( imagelist.size() % 2 != 0 )
    {
        cout << "Error: the image list contains odd (non-even) number of elements\n";
        return;
    }

    const int maxScale = 2;
    // ARRAY AND VECTOR STORAGE:

    vector<vector<Point2f> > imagePoints[2];
    vector<vector<Point3f> > objectPoints;
    Size imageSize;

    int i, j, k, nimages = (int)imagelist.size()/2;

    imagePoints[0].resize(nimages);
    imagePoints[1].resize(nimages);
    vector<string> goodImageList;

    for( i = j = 0; i < nimages; i++ )
    {
        for( k = 0; k < 2; k++ )
        {
            const string& filename = imagelist[i*2+k];
            Mat img = imread(filename, 0);
            if(img.empty())
                break;
            if( imageSize == Size() )
                imageSize = img.size();
            else if( img.size() != imageSize )
            {
                cout << "The image " << filename << " has the size different from the first image size. Skipping the pair\n";
                break;
            }
            bool found = false;
            vector<Point2f>& corners = imagePoints[k][j];
            for( int scale = 1; scale <= maxScale; scale++ )
            {
                Mat timg;
                if( scale == 1 )
                    timg = img;
                else
                    resize(img, timg, Size(), scale, scale, INTER_LINEAR_EXACT);
                found = findChessboardCorners(timg, boardSize, corners,
                    CALIB_CB_ADAPTIVE_THRESH | CALIB_CB_NORMALIZE_IMAGE);
                if( found )
                {
                    if( scale > 1 )
                    {
                        Mat cornersMat(corners);
                        cornersMat *= 1./scale;
                    }
                    break;
                }
            }
            if( displayCorners )
            {
                cout << filename << endl;
                Mat cimg, cimg1;
                cvtColor(img, cimg, COLOR_GRAY2BGR);
                drawChessboardCorners(cimg, boardSize, corners, found);
                double sf = 640./MAX(img.rows, img.cols);
                resize(cimg, cimg1, Size(), sf, sf, INTER_LINEAR_EXACT);
                imshow("corners", cimg1);
                char c = (char)waitKey(500);
                if( c == 27 || c == 'q' || c == 'Q' ) //Allow ESC to quit
                    exit(-1);
            }
            else
                putchar('.');
            if( !found )
                break;
            cornerSubPix(img, corners, Size(11,11), Size(-1,-1),
                         TermCriteria(TermCriteria::COUNT+TermCriteria::EPS,
                                      30, 0.01));
        }
        if( k == 2 )
        {
            goodImageList.push_back(imagelist[i*2]);
            goodImageList.push_back(imagelist[i*2+1]);
            j++;
        }
    }
    cout << j << " pairs have been successfully detected.\n";
    nimages = j;
    if( nimages < 2 )
    {
        cout << "Error: too little pairs to run the calibration\n";
        return;
    }

    imagePoints[0].resize(nimages);
    imagePoints[1].resize(nimages);
    objectPoints.resize(nimages);

    for( i = 0; i < nimages; i++ )
    {
        for( j = 0; j < boardSize.height; j++ )
            for( k = 0; k < boardSize.width; k++ )
                objectPoints[i].push_back(Point3f(k*squareSize, j*squareSize, 0));
    }

    cout << "Running stereo calibration ...\n";

    Mat cameraMatrix[2], distCoeffs[2];
    cameraMatrix[0] = initCameraMatrix2D(objectPoints,imagePoints[0],imageSize,0);
    cameraMatrix[1] = initCameraMatrix2D(objectPoints,imagePoints[1],imageSize,0);
    Mat R, T, E, F;

    double rms = stereoCalibrate(objectPoints, imagePoints[0], imagePoints[1],
                    cameraMatrix[0], distCoeffs[0],
                    cameraMatrix[1], distCoeffs[1],
                    imageSize, R, T, E, F,
                    CALIB_FIX_ASPECT_RATIO +
                    CALIB_ZERO_TANGENT_DIST +
                    CALIB_USE_INTRINSIC_GUESS +
                    CALIB_SAME_FOCAL_LENGTH +
                    CALIB_RATIONAL_MODEL +
                    CALIB_FIX_K3 + CALIB_FIX_K4 + CALIB_FIX_K5,
                    TermCriteria(TermCriteria::COUNT+TermCriteria::EPS, 100, 1e-5) );
    cout << "done with RMS error=" << rms << endl;

// CALIBRATION QUALITY CHECK
// because the output fundamental matrix implicitly
// includes all the output information,
// we can check the quality of calibration using the
// epipolar geometry constraint: m2^t*F*m1=0
    double err = 0;
    int npoints = 0;
    vector<Vec3f> lines[2];
    for( i = 0; i < nimages; i++ )
    {
        int npt = (int)imagePoints[0][i].size();
        Mat imgpt[2];
        for( k = 0; k < 2; k++ )
        {
            imgpt[k] = Mat(imagePoints[k][i]);
            undistortPoints(imgpt[k], imgpt[k], cameraMatrix[k], distCoeffs[k], Mat(), cameraMatrix[k]);
            computeCorrespondEpilines(imgpt[k], k+1, F, lines[k]);
        }
        for( j = 0; j < npt; j++ )
        {
            double errij = fabs(imagePoints[0][i][j].x*lines[1][j][0] +
                                imagePoints[0][i][j].y*lines[1][j][1] + lines[1][j][2]) +
                           fabs(imagePoints[1][i][j].x*lines[0][j][0] +
                                imagePoints[1][i][j].y*lines[0][j][1] + lines[0][j][2]);
            err += errij;
        }
        npoints += npt;
    }
    cout << "average epipolar err = " <<  err/npoints << endl;

    // save intrinsic parameters
    FileStorage fs("intrinsics.yml", FileStorage::WRITE);
    if( fs.isOpened() )
    {
        fs << "M1" << cameraMatrix[0] << "D1" << distCoeffs[0] <<
            "M2" << cameraMatrix[1] << "D2" << distCoeffs[1];
        fs.release();
    }
    else
        cout << "Error: can not save the intrinsic parameters\n";

    Mat R1, R2, P1, P2, Q;
    Rect validRoi[2];

    stereoRectify(cameraMatrix[0], distCoeffs[0],
                  cameraMatrix[1], distCoeffs[1],
                  imageSize, R, T, R1, R2, P1, P2, Q,
                  CALIB_ZERO_DISPARITY, 1, imageSize, &validRoi[0], &validRoi[1]);

    fs.open("extrinsics.yml", FileStorage::WRITE);
    if( fs.isOpened() )
    {
        fs << "R" << R << "T" << T << "R1" << R1 << "R2" << R2 << "P1" << P1 << "P2" << P2 << "Q" << Q;
        fs.release();
    }
    else
        cout << "Error: can not save the extrinsic parameters\n";

    // OpenCV can handle left-right
    // or up-down camera arrangements
    bool isVerticalStereo = fabs(P2.at<double>(1, 3)) > fabs(P2.at<double>(0, 3));

// COMPUTE AND DISPLAY RECTIFICATION
    if( !showRectified )
        return;

    Mat rmap[2][2];
// IF BY CALIBRATED (BOUGUET'S METHOD)
    if( useCalibrated )
    {
        // we already computed everything
    }
// OR ELSE HARTLEY'S METHOD
    else
 // use intrinsic parameters of each camera, but
 // compute the rectification transformation directly
 // from the fundamental matrix
    {
        vector<Point2f> allimgpt[2];
        for( k = 0; k < 2; k++ )
        {
            for( i = 0; i < nimages; i++ )
                std::copy(imagePoints[k][i].begin(), imagePoints[k][i].end(), back_inserter(allimgpt[k]));
        }
        F = findFundamentalMat(Mat(allimgpt[0]), Mat(allimgpt[1]), FM_8POINT, 0, 0);
        Mat H1, H2;
        stereoRectifyUncalibrated(Mat(allimgpt[0]), Mat(allimgpt[1]), F, imageSize, H1, H2, 3);

        R1 = cameraMatrix[0].inv()*H1*cameraMatrix[0];
        R2 = cameraMatrix[1].inv()*H2*cameraMatrix[1];
        P1 = cameraMatrix[0];
        P2 = cameraMatrix[1];
    }

    //Precompute maps for cv::remap()
    initUndistortRectifyMap(cameraMatrix[0], distCoeffs[0], R1, P1, imageSize, CV_16SC2, rmap[0][0], rmap[0][1]);
    initUndistortRectifyMap(cameraMatrix[1], distCoeffs[1], R2, P2, imageSize, CV_16SC2, rmap[1][0], rmap[1][1]);

    Mat canvas;
    Mat canvas_orig;
    double sf;
    int w, h;
    if( !isVerticalStereo )
    {
        sf = 600./MAX(imageSize.width, imageSize.height);
        w = cvRound(imageSize.width*sf);
        h = cvRound(imageSize.height*sf);
        canvas.create(h, w*2, CV_8UC3);
        canvas_orig.create(h, w*2, CV_8UC3);
    }
    else
    {
        sf = 300./MAX(imageSize.width, imageSize.height);
        w = cvRound(imageSize.width*sf);
        h = cvRound(imageSize.height*sf);
        canvas.create(h*2, w, CV_8UC3);
        canvas_orig.create(h*2, w, CV_8UC3);
    }

    for( i = 0; i < nimages; i++ )
    {
        for( k = 0; k < 2; k++ )
        {
            Mat img = imread(goodImageList[i*2+k], 0), rimg, cimg, gimg;
            remap(img, rimg, rmap[k][0], rmap[k][1], INTER_LINEAR);
            cvtColor(rimg, cimg, COLOR_GRAY2BGR);
            cvtColor(img, gimg, COLOR_GRAY2BGR);
            Mat canvasPart = !isVerticalStereo ? canvas(Rect(w*k, 0, w, h)) : canvas(Rect(0, h*k, w, h));
            Mat canvasPart_orig = !isVerticalStereo ? canvas_orig(Rect(w*k, 0, w, h)) : canvas_orig(Rect(0, h*k, w, h));
            resize(cimg, canvasPart, canvasPart.size(), 0, 0, INTER_AREA);
            resize(gimg, canvasPart_orig, canvasPart_orig.size(), 0, 0, INTER_AREA);
            if( useCalibrated )
            {
                Rect vroi(cvRound(validRoi[k].x*sf), cvRound(validRoi[k].y*sf),
                          cvRound(validRoi[k].width*sf), cvRound(validRoi[k].height*sf));
                rectangle(canvasPart, vroi, Scalar(0,0,255), 3, 8);
                rectangle(canvasPart_orig, vroi, Scalar(0,0,255), 3, 8);
            }
        }

        if( !isVerticalStereo )
            for( j = 0; j < canvas.rows; j += 16 )
            {
                line(canvas, Point(0, j), Point(canvas.cols, j), Scalar(0, 255, 0), 1, 8);
                line(canvas_orig, Point(0, j), Point(canvas_orig.cols, j), Scalar(0, 255, 0), 1, 8);
            }
        else
            for( j = 0; j < canvas.cols; j += 16 )
            {
                line(canvas, Point(j, 0), Point(j, canvas.rows), Scalar(0, 255, 0), 1, 8);
                line(canvas_orig, Point(j, 0), Point(j, canvas_orig.rows), Scalar(0, 255, 0), 1, 8);
            }
        imshow("rectified", canvas);
        imshow("unrectified", canvas_orig);
        char c = (char)waitKey();
        if( c == 27 || c == 'q' || c == 'Q' )
            break;
    }
}